

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_newline.c
# Opt level: O3

BOOL coda__pcre2_was_newline_8
               (PCRE2_SPTR8 ptr,uint32_t type,PCRE2_SPTR8 startptr,uint32_t *lenptr,BOOL utf)

{
  byte bVar1;
  uint32_t uVar2;
  
  bVar1 = ptr[-1];
  uVar2 = 1;
  if (type == 2) {
    if (bVar1 == 0xd) goto LAB_0014adce;
  }
  else {
    if (bVar1 - 0xb < 3) goto LAB_0014adce;
    if (bVar1 == 0x85) {
      uVar2 = 2 - (utf == 0);
      goto LAB_0014adce;
    }
  }
  if (bVar1 != 10) {
    return 0;
  }
  if (startptr < ptr + -1) {
    uVar2 = (ptr[-2] == '\r') + 1;
  }
LAB_0014adce:
  *lenptr = uVar2;
  return 1;
}

Assistant:

BOOL
PRIV(was_newline)(PCRE2_SPTR ptr, uint32_t type, PCRE2_SPTR startptr,
  uint32_t *lenptr, BOOL utf)
{
uint32_t c;
ptr--;

#ifdef SUPPORT_UNICODE
if (utf)
  {
  BACKCHAR(ptr);
  GETCHAR(c, ptr);
  }
else c = *ptr;
#else
(void)utf;
c = *ptr;
#endif  /* SUPPORT_UNICODE */

if (type == NLTYPE_ANYCRLF) switch(c)
  {
  case CHAR_LF:
  *lenptr = (ptr > startptr && ptr[-1] == CHAR_CR)? 2 : 1;
  return TRUE;

  case CHAR_CR:
  *lenptr = 1;
  return TRUE;

  default:
  return FALSE;
  }

/* NLTYPE_ANY */

else switch(c)
  {
  case CHAR_LF:
  *lenptr = (ptr > startptr && ptr[-1] == CHAR_CR)? 2 : 1;
  return TRUE;

#ifdef EBCDIC
  case CHAR_NEL:
#endif
  case CHAR_VT:
  case CHAR_FF:
  case CHAR_CR:
  *lenptr = 1;
  return TRUE;

#ifndef EBCDIC
#if PCRE2_CODE_UNIT_WIDTH == 8
  case CHAR_NEL:
  *lenptr = utf? 2 : 1;
  return TRUE;

  case 0x2028:   /* LS */
  case 0x2029:   /* PS */
  *lenptr = 3;
  return TRUE;

#else /* 16-bit or 32-bit code units */
  case CHAR_NEL:
  case 0x2028:   /* LS */
  case 0x2029:   /* PS */
  *lenptr = 1;
  return TRUE;
#endif
#endif /* Not EBCDIC */

  default:
  return FALSE;
  }
}